

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O0

void __thiscall QHexView::calcColumns(QHexView *this)

{
  qreal qVar1;
  QRect local_58;
  QRectF local_48;
  uint local_28;
  uint local_24;
  uint j;
  uint i;
  qreal cw;
  qreal x;
  QHexView *this_local;
  
  if (this->m_hexdocument != (QHexDocument *)0x0) {
    x = (qreal)this;
    QList<QRectF>::clear(&this->m_hexcolumns);
    QList<QRectF>::reserve(&this->m_hexcolumns,(ulong)(this->m_options).linelength);
    cw = hexColumnX(this);
    qVar1 = cellWidth(this);
    _j = qVar1 * 2.0;
    for (local_24 = 0; local_24 < (this->m_options).linelength; local_24 = local_24 + 1) {
      for (local_28 = 0; local_28 < (this->m_options).grouplength; local_28 = local_28 + 1) {
        QRect::QRect(&local_58,(int)cw,0,(int)_j,0);
        QRectF::QRectF(&local_48,&local_58);
        QList<QRectF>::push_back(&this->m_hexcolumns,&local_48);
        cw = _j + cw;
      }
      qVar1 = cellWidth(this);
      cw = qVar1 + cw;
    }
  }
  return;
}

Assistant:

void QHexView::calcColumns() {
    if(!m_hexdocument)
        return;

    m_hexcolumns.clear();
    m_hexcolumns.reserve(m_options.linelength);

    auto x = this->hexColumnX(), cw = this->cellWidth() * 2;

    for(auto i = 0u; i < m_options.linelength; i++) {
        for(auto j = 0u; j < m_options.grouplength; j++, x += cw)
            m_hexcolumns.push_back(QRect(x, 0, cw, 0));

        x += this->cellWidth();
    }
}